

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacCom.c
# Opt level: O3

int Bac_CommandPut(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Bac_Man_t *p;
  int iVar1;
  Gia_Man_t *pNew;
  char *pcVar2;
  uint fVerbose;
  uint fBuffers;
  char *pcVar3;
  
  p = (Bac_Man_t *)pAbc->pAbcBac;
  fVerbose = 0;
  Extra_UtilGetoptReset();
  fBuffers = 1;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"bvh"), iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) break;
    if (iVar1 != 0x62) {
      Abc_Print(-2,"usage: @_put [-bvh]\n");
      Abc_Print(-2,"\t         extracts AIG from the hierarchical design\n");
      pcVar3 = "yes";
      pcVar2 = "yes";
      if (fBuffers == 0) {
        pcVar2 = "no";
      }
      Abc_Print(-2,"\t-b     : toggle using barrier buffers [default = %s]\n",pcVar2);
      if (fVerbose == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
    fBuffers = fBuffers ^ 1;
  }
  if (p == (Bac_Man_t *)0x0) {
    pcVar2 = "Bac_CommandPut(): There is no current design.\n";
  }
  else {
    pNew = Bac_ManExtract(p,fBuffers,fVerbose);
    if (pNew != (Gia_Man_t *)0x0) {
      Abc_FrameUpdateGia(pAbc,pNew);
      return 0;
    }
    pcVar2 = "Bac_CommandPut(): Conversion to AIG has failed.\n";
  }
  Abc_Print(1,pcVar2);
  return 0;
}

Assistant:

int Bac_CommandPut( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Bac_Man_t * p = Bac_AbcGetMan(pAbc);
    Gia_Man_t * pGia = NULL;
    int c, fBarBufs = 1, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "bvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'b':
            fBarBufs ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( p == NULL )
    {
        Abc_Print( 1, "Bac_CommandPut(): There is no current design.\n" );
        return 0;
    }
    pGia = Bac_ManExtract( p, fBarBufs, fVerbose );
    if ( pGia == NULL )
    {
        Abc_Print( 1, "Bac_CommandPut(): Conversion to AIG has failed.\n" );
        return 0;
    }
    Abc_FrameUpdateGia( pAbc, pGia );
    return 0;
usage:
    Abc_Print( -2, "usage: @_put [-bvh]\n" );
    Abc_Print( -2, "\t         extracts AIG from the hierarchical design\n" );
    Abc_Print( -2, "\t-b     : toggle using barrier buffers [default = %s]\n", fBarBufs? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}